

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O1

int AF_A_FirePlasma(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *source;
  undefined8 *puVar2;
  player_t *player;
  AWeapon *this;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  void *pvVar8;
  FState *flashstate;
  PClassActor *type;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00594b6a;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    source = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar5 = numparam;
    if (source != (AActor *)0x0) {
      if ((source->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
        (source->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar7 = (source->super_DThinker).super_DObject.Class;
      bVar10 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar10;
      uVar5 = (uint)bVar10;
      pVVar9 = (VMValue *)(ulong)(pPVar7 == pPVar3 || bVar10);
      if (pPVar7 != pPVar3 && !bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar3) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00594b6a;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_00594b3f;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar6 = (**(code **)*puVar2)(puVar2,pVVar9,uVar5,ret);
          puVar2[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar2[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00594b6a;
        }
      }
    }
    if ((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) {
      pvVar8 = (void *)0x0;
    }
    else {
      if ((VVar1 != '\x03') ||
         ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))) {
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
        goto LAB_00594b6a;
      }
      pvVar8 = param[2].field_0.field_1.a;
    }
    player = source->player;
    if (player != (player_t *)0x0) {
      this = player->ReadyWeapon;
      if ((pvVar8 != (void *)0x0 && this != (AWeapon *)0x0) && (*(int *)((long)pvVar8 + 8) == 1)) {
        bVar10 = AWeapon::DepleteAmmo(this,this->bAltFire,true,1);
        if (!bVar10) {
          return 0;
        }
        local_2c.Index = 0xa3;
        flashstate = AActor::FindState((AActor *)this,&local_2c);
        if (flashstate != (FState *)0x0) {
          uVar5 = FRandom::GenRand32(&pr_fireplasma);
          P_SetSafeFlash(this,player,flashstate,uVar5 & 1);
        }
      }
      type = PClass::FindActor("PlasmaBall");
      P_SpawnPlayerMissile(source,type);
    }
    return 0;
  }
LAB_00594b3f:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00594b6a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePlasma)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;

		FState *flash = weapon->FindState(NAME_Flash);
		if (flash != NULL)
		{
			P_SetSafeFlash(weapon, player, flash, (pr_fireplasma()&1));
		}
	}

	P_SpawnPlayerMissile (self, PClass::FindActor("PlasmaBall"));
	return 0;
}